

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFPageObjectHelper::parseContents(QPDFPageObjectHelper *this,ParserCallbacks *callbacks)

{
  bool bVar1;
  undefined1 local_58 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  ParserCallbacks *callbacks_local;
  QPDFPageObjectHelper *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)callbacks;
  callbacks_local = (ParserCallbacks *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd8);
  bVar1 = QPDFObjectHandle::isFormXObject((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (bVar1) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)(local_58 + 0x10));
    QPDFObjectHandle::parseAsContents
              ((QPDFObjectHandle *)(local_58 + 0x10),(ParserCallbacks *)local_18._M_pi);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_58 + 0x10));
  }
  else {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_58);
    QPDFObjectHandle::parsePageContents
              ((QPDFObjectHandle *)local_58,(ParserCallbacks *)local_18._M_pi);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_58);
  }
  return;
}

Assistant:

void
QPDFPageObjectHelper::parseContents(QPDFObjectHandle::ParserCallbacks* callbacks)
{
    if (oh().isFormXObject()) {
        oh().parseAsContents(callbacks);
    } else {
        oh().parsePageContents(callbacks);
    }
}